

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

int64_t absl::lts_20250127::IDivDuration(Duration num,Duration den,Duration *rem)

{
  bool bVar1;
  int64_t iVar2;
  int64_t q;
  
  q = 0;
  bVar1 = anon_unknown_1::IDivFastPath(num,den,&q,rem);
  if (bVar1) {
    return q;
  }
  iVar2 = anon_unknown_1::IDivSlowPath(true,num,den,rem);
  return iVar2;
}

Assistant:

int64_t IDivDuration(Duration num, Duration den, Duration* rem) {
  return IDivDurationImpl(true, num, den,
                          rem);  // trunc towards zero
}